

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recv.c
# Opt level: O2

yrmcds_error yrmcds_recv(yrmcds *c,yrmcds_response *r)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  ushort uVar6;
  yrmcds_error yVar7;
  uint32_t uVar8;
  int iVar9;
  void *pvVar10;
  char *pcVar11;
  char cVar12;
  ulong uVar13;
  char *pcVar14;
  uint64_t uVar15;
  ulong *puVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  long *__s1;
  size_t __n;
  long *plVar21;
  size_t sStack_50;
  
  if (r == (yrmcds_response *)0x0 || c == (yrmcds *)0x0) {
    return YRMCDS_BAD_ARGUMENT;
  }
  if (c->invalid != 0) {
    return YRMCDS_PROTOCOL_ERROR;
  }
  sVar5 = c->last_size;
  if (sVar5 != 0) {
    __n = c->used - sVar5;
    if (__n != 0) {
      memmove(c->recvbuf,c->recvbuf + sVar5,__n);
    }
    c->used = __n;
    c->last_size = 0;
    free(c->decompressed);
    c->decompressed = (char *)0x0;
  }
  if (c->text_mode != 0) {
    do {
      if (c->used != 0) {
        pcVar11 = c->recvbuf;
        pvVar10 = memchr(pcVar11,10,c->used);
        if (pvVar10 != (void *)0x0) {
          if (((long)pvVar10 - (long)pcVar11 < 2) || (*(char *)((long)pvVar10 + -1) != '\r'))
          goto LAB_00126f4b;
          pcVar18 = (char *)((long)pvVar10 + -1);
          uVar13 = (long)pcVar18 - (long)pcVar11;
          r->data_len = 0;
          r->value = 0;
          r->key_len = 0;
          r->data = (char *)0x0;
          *(undefined8 *)&r->flags = 0;
          r->key = (char *)0x0;
          r->status = YRMCDS_STATUS_OK;
          r->command = YRMCDS_CMD_GET;
          r->cas_unique = 0;
          *(undefined8 *)r = 0;
          r->length = 0;
          uVar8 = c->rserial + 1;
          c->rserial = uVar8;
          r->serial = uVar8;
          sVar5 = uVar13 + 2;
          r->length = sVar5;
          r->command = YRMCDS_CMD_BOTTOM;
          switch(uVar13) {
          case 2:
            if (*(short *)c->recvbuf == 0x4b4f) {
              sStack_50 = 4;
              goto LAB_00126efc;
            }
            break;
          case 3:
            iVar9 = bcmp(c->recvbuf,"END",3);
            if (iVar9 == 0) {
              r->status = YRMCDS_STATUS_NOTFOUND;
              sStack_50 = 5;
              goto LAB_00126efc;
            }
            break;
          case 5:
            iVar9 = bcmp(c->recvbuf,"ERROR",5);
            if (iVar9 == 0) {
              r->status = YRMCDS_STATUS_UNKNOWNCOMMAND;
              sStack_50 = 7;
              goto LAB_00126efc;
            }
            break;
          case 6:
            pcVar14 = c->recvbuf;
            iVar9 = bcmp(pcVar14,"STORED",6);
            sStack_50 = 8;
            if (iVar9 == 0) goto LAB_00126efc;
            iVar9 = bcmp(pcVar14,"EXISTS",6);
            if (iVar9 == 0) {
              r->status = YRMCDS_STATUS_EXISTS;
              goto LAB_00126efc;
            }
            break;
          case 7:
            pcVar14 = c->recvbuf;
            iVar9 = bcmp(pcVar14,"DELETED",7);
            sStack_50 = 9;
            if ((iVar9 == 0) || (iVar9 = bcmp(pcVar14,"TOUCHED",7), iVar9 == 0)) goto LAB_00126efc;
            break;
          case 9:
            iVar9 = bcmp(c->recvbuf,"NOT_FOUND",9);
            if (iVar9 == 0) {
              r->status = YRMCDS_STATUS_NOTFOUND;
              sStack_50 = 0xb;
              goto LAB_00126efc;
            }
            break;
          case 10:
            iVar9 = bcmp(c->recvbuf,"NOT_STORED",10);
            if (iVar9 == 0) {
              r->status = YRMCDS_STATUS_NOTSTORED;
              sStack_50 = 0xc;
              goto LAB_00126efc;
            }
          }
          sStack_50 = sVar5;
          if (pcVar18 != pcVar11) {
            pcVar11 = c->recvbuf;
            cVar12 = *pcVar11;
            if ((byte)(cVar12 - 0x30U) < 10) goto LAB_00126d1c;
          }
          if (uVar13 < 9) {
            __s1 = (long *)c->recvbuf;
            if (uVar13 < 7) goto LAB_00126ebb;
          }
          else {
            __s1 = (long *)c->recvbuf;
            if (*__s1 == 0x204e4f4953524556) {
              r->data_len = uVar13 - 8;
              r->data = (char *)(__s1 + 1);
              goto LAB_00126efc;
            }
          }
          iVar9 = bcmp(__s1,"VALUE ",6);
          if (iVar9 == 0) {
            pcVar11 = (char *)((long)__s1 + 5);
            plVar21 = __s1;
            do {
              plVar21 = (long *)((long)plVar21 + 1);
              pcVar14 = pcVar11 + 1;
              pcVar11 = pcVar11 + 1;
            } while (*pcVar14 == ' ');
            if ((pcVar11 != pcVar18) &&
               (pvVar10 = memchr(pcVar11,0x20,(long)pvVar10 + (-6 - (long)plVar21)),
               pvVar10 != (void *)0x0)) {
              r->key = pcVar11;
              r->key_len = (long)pvVar10 + (-5 - (long)plVar21);
              pcVar11 = (char *)((long)pvVar10 + -3);
              do {
                cVar12 = pcVar11[3];
                pcVar11 = pcVar11 + 1;
              } while (cVar12 == ' ');
              uVar8 = 0;
              while ((byte)(cVar12 - 0x30U) < 10) {
                uVar8 = (uint)(byte)(cVar12 - 0x30U) + uVar8 * 10;
                pcVar18 = pcVar11 + 3;
                pcVar11 = pcVar11 + 1;
                cVar12 = *pcVar18;
              }
              if (cVar12 == ' ') {
                r->flags = uVar8;
                do {
                  cVar12 = pcVar11[2];
                  pcVar11 = pcVar11 + 1;
                } while (cVar12 == ' ');
                uVar20 = 0;
                while ((byte)(cVar12 - 0x30U) < 10) {
                  uVar20 = (ulong)(byte)(cVar12 - 0x30U) + uVar20 * 10;
                  pcVar18 = pcVar11 + 2;
                  pcVar11 = pcVar11 + 1;
                  cVar12 = *pcVar18;
                }
                if (0x3200000 < uVar20) {
LAB_00126f4b:
                  c->invalid = 1;
                  return YRMCDS_PROTOCOL_ERROR;
                }
                do {
                  pcVar18 = pcVar11 + 1;
                  pcVar11 = pcVar11 + 1;
                } while (*pcVar18 == ' ');
                if (0xf5 < (byte)(*pcVar18 - 0x3aU)) {
                  do {
                    cVar12 = *pcVar11;
                    pcVar11 = pcVar11 + 1;
                  } while (cVar12 == ' ');
                  uVar15 = 0;
                  while ((byte)(cVar12 - 0x30U) < 10) {
                    uVar15 = (ulong)(byte)(cVar12 - 0x30U) + uVar15 * 10;
                    cVar12 = *pcVar11;
                    pcVar11 = pcVar11 + 1;
                  }
                  sStack_50 = uVar13 + uVar20 + 9;
                  while (c->used < sStack_50) {
                    yVar7 = recv_data(c);
                    if (yVar7 != YRMCDS_OK) {
                      return yVar7;
                    }
                  }
                  pcVar11 = c->recvbuf;
                  iVar9 = bcmp(pcVar11 + sVar5 + uVar20,"\r\nEND\r\n",7);
                  if (iVar9 != 0) goto LAB_00126f4b;
                  r->length = sStack_50;
                  r->flags = uVar8;
                  r->data = pcVar11 + sVar5;
                  r->data_len = uVar20;
                  r->cas_unique = uVar15;
                  goto LAB_00126efc;
                }
              }
            }
          }
LAB_00126ebb:
          r->status = YRMCDS_STATUS_OTHER;
          fprintf(_stderr,"[libyrmcds] unknown response: %.*s\n",uVar13,__s1);
          sStack_50 = r->length;
          goto LAB_00126efc;
        }
      }
      yVar7 = recv_data(c);
      if (yVar7 != YRMCDS_OK) {
        return yVar7;
      }
    } while( true );
  }
  while (c->used < 0x18) {
    yVar7 = recv_data(c);
    if (yVar7 != YRMCDS_OK) {
      return yVar7;
    }
  }
  if (*c->recvbuf == -0x7f) {
    uVar19 = *(uint *)(c->recvbuf + 8);
    uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
    if (uVar19 < 0x3200001) {
      sStack_50 = (size_t)(uVar19 + 0x18);
      while (c->used < sStack_50) {
        yVar7 = recv_data(c);
        if (yVar7 != YRMCDS_OK) {
          return yVar7;
        }
      }
      pcVar11 = c->recvbuf;
      uVar3 = *(ushort *)(pcVar11 + 2);
      uVar6 = uVar3 << 8 | uVar3 >> 8;
      bVar1 = pcVar11[4];
      uVar17 = (uint)uVar6 + (uint)bVar1;
      if (uVar17 <= uVar19) {
        pcVar14 = pcVar11 + (ulong)bVar1 + 0x18;
        r->length = sStack_50;
        bVar2 = pcVar11[1];
        pcVar18 = (char *)0x0;
        if (uVar3 != 0) {
          pcVar18 = pcVar14;
        }
        r->command = (uint)bVar2;
        r->key = pcVar18;
        r->key_len = (ulong)uVar6;
        uVar3 = *(ushort *)(pcVar11 + 6);
        r->status = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
        r->serial = *(uint32_t *)(pcVar11 + 0xc);
        pcVar11 = c->recvbuf;
        uVar13 = *(ulong *)(pcVar11 + 0x10);
        r->cas_unique =
             uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
             (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
             (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
             uVar13 << 0x38;
        r->flags = 0;
        if ((ulong)bVar1 != 0) {
          if (bVar1 != 4) goto LAB_00126bbf;
          uVar4 = *(uint *)(pcVar11 + 0x18);
          r->flags = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
          ;
        }
        if (uVar3 != 0 || 1 < bVar2 - YRMCDS_CMD_INCREMENT) {
          r->value = 0;
          puVar16 = (ulong *)(pcVar14 + uVar6);
          if (uVar19 == uVar17) {
            puVar16 = (ulong *)0x0;
          }
          r->data = (char *)puVar16;
          r->data_len = (ulong)(uVar19 - uVar17);
          c->last_size = sStack_50;
          return YRMCDS_OK;
        }
        r->data = (char *)0x0;
        r->data_len = 0;
        if (uVar19 - uVar17 == 8) {
          uVar13 = *(ulong *)(pcVar14 + uVar6);
          r->value = uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                     (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                     (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                     (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
          goto LAB_00126efc;
        }
      }
    }
  }
LAB_00126bbf:
  c->invalid = 1;
  return YRMCDS_PROTOCOL_ERROR;
LAB_00126d1c:
  while (pcVar11 = pcVar11 + 1, cVar12 == ' ') {
    cVar12 = *pcVar11;
  }
  uVar15 = 0;
  while ((byte)(cVar12 - 0x30U) < 10) {
    uVar15 = (ulong)(byte)(cVar12 - 0x30U) + uVar15 * 10;
    cVar12 = *pcVar11;
    pcVar11 = pcVar11 + 1;
  }
  r->value = uVar15;
LAB_00126efc:
  c->last_size = sStack_50;
  return YRMCDS_OK;
}

Assistant:

yrmcds_error yrmcds_recv(yrmcds* c, yrmcds_response* r) {
    if( c == NULL || r == NULL )
        return YRMCDS_BAD_ARGUMENT;
    if( c->invalid )
        return YRMCDS_PROTOCOL_ERROR;

    if( c->last_size > 0 ) {
        size_t remain = c->used - c->last_size;
        if( remain > 0 )
            memmove(c->recvbuf, c->recvbuf + c->last_size, remain);
        c->used = remain;
        c->last_size = 0;
        free(c->decompressed);
        c->decompressed = NULL;
    }

    if( c->text_mode ) {
        return text_recv(c, r);
    }

    while( c->used < BINARY_HEADER_SIZE ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    if( *c->recvbuf != '\x81' ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    uint32_t total_len = ntoh32(c->recvbuf + 8);
    if( total_len > MAX_CAPACITY ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    while( c->used < (BINARY_HEADER_SIZE + total_len) ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    uint16_t key_len = ntoh16(c->recvbuf + 2);
    uint8_t extras_len = *(unsigned char*)(c->recvbuf + 4);
    if( total_len < (key_len + extras_len) ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }

    const char* pkey = c->recvbuf + (BINARY_HEADER_SIZE + extras_len);
    r->length = BINARY_HEADER_SIZE + total_len;
    r->command = *(unsigned char*)(c->recvbuf + 1);
    r->key = key_len ? pkey : NULL;
    r->key_len = key_len;
    r->status = ntoh16(c->recvbuf + 6);
    memcpy(&(r->serial), c->recvbuf + 12, 4);
    r->cas_unique = ntoh64(c->recvbuf + 16);
    r->flags = 0;
    if( extras_len > 0 ) {
        if( extras_len != 4 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags = ntoh32(c->recvbuf + BINARY_HEADER_SIZE);
    }

    size_t data_len = total_len - key_len - extras_len;
    const char* pdata = pkey + key_len;

    if( (r->command == YRMCDS_CMD_INCREMENT ||
         r->command == YRMCDS_CMD_DECREMENT) &&
        (r->status == YRMCDS_STATUS_OK) ) {
        r->data = NULL;
        r->data_len = 0;
        if( data_len != 8 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->value = ntoh64(pdata);
        c->last_size = r->length;
        return YRMCDS_OK;
    }
    r->value = 0;
    r->data = data_len ? pdata : NULL;
    r->data_len = data_len;

#ifdef LIBYRMCDS_USE_LZ4
    if( c->compress_size && (r->flags & YRMCDS_FLAG_COMPRESS) ) {
        if( data_len == 0 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags &= ~(uint32_t)YRMCDS_FLAG_COMPRESS;
        uint32_t decompress_size = ntoh32(pdata);
        if( UINT32_MAX > INT_MAX ) {
            if( decompress_size > INT_MAX ) {
                c->invalid = 1;
                return YRMCDS_PROTOCOL_ERROR;
            }
        }
        c->decompressed = (char*)malloc(decompress_size);
        if( c->decompressed == NULL )
            return YRMCDS_OUT_OF_MEMORY;
        int d = LZ4_decompress_safe(pdata + sizeof(uint32_t),
                                    c->decompressed,
                                    (int)(data_len - sizeof(uint32_t)),
                                    (int)decompress_size);
        if( d != decompress_size ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->data = c->decompressed;
        r->data_len = decompress_size;
    }
#endif // LIBYRMCDS_USE_LZ4

    c->last_size = r->length;
    return YRMCDS_OK;
}